

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlSetObjectString(JlDataObject *StringObject,char *String)

{
  char *pcVar1;
  size_t local_28;
  size_t length;
  JL_STATUS jlStatus;
  char *String_local;
  JlDataObject *StringObject_local;
  
  if (StringObject == (JlDataObject *)0x0) {
    length._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else if (StringObject->Type == JL_DATA_TYPE_STRING) {
    if ((StringObject->field_2).String != (char *)0x0) {
      WjTestLib_Free((StringObject->field_2).String);
      (StringObject->field_2).String = (char *)0x0;
    }
    local_28 = 0;
    if (String != (char *)0x0) {
      local_28 = strlen(String);
    }
    if (local_28 == 0) {
      length._4_4_ = JL_STATUS_SUCCESS;
    }
    else {
      pcVar1 = JlStrDup(String);
      (StringObject->field_2).String = pcVar1;
      if ((StringObject->field_2).String == (char *)0x0) {
        length._4_4_ = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        length._4_4_ = JL_STATUS_SUCCESS;
      }
    }
  }
  else {
    length._4_4_ = JL_STATUS_WRONG_TYPE;
  }
  return length._4_4_;
}

Assistant:

JL_STATUS
    JlSetObjectString
    (
        JlDataObject*   StringObject,
        char const*     String
    )
{
    JL_STATUS jlStatus;

    if( NULL != StringObject )
    {
        if( JL_DATA_TYPE_STRING == StringObject->Type )
        {
            if( NULL != StringObject->String )
            {
                // Remove existing string
                JlFree( StringObject->String );
                StringObject->String = NULL;
            }

            size_t length = 0;
            if( NULL != String )
            {
                length = strlen( String );
            }

            if( length > 0 )
            {
                // Only create a buffer if there is data. No need to just store a Zero terminator.
                StringObject->String = JlStrDup( String );
                if( NULL != StringObject->String )
                {
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    jlStatus = JL_STATUS_OUT_OF_MEMORY;
                }
            }
            else
            {
                // Nothing more to do.
                jlStatus = JL_STATUS_SUCCESS;
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}